

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O1

void __thiscall
helics::TimeCoordinator::removeDependency(TimeCoordinator *this,GlobalFederateId fedID)

{
  GlobalFederateId *__src;
  pointer *ppGVar1;
  GlobalFederateId *pGVar2;
  shared_guarded_m<std::vector<GlobalFederateId>_> *psVar3;
  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  __dest;
  handle dlock;
  BaseType local_34;
  shared_guarded_m<std::vector<GlobalFederateId>_> *local_30;
  unique_lock<std::mutex> local_28;
  
  local_34 = fedID.gid;
  TimeDependencies::removeDependency(&(this->super_BaseTimeCoordinator).dependencies,fedID);
  local_30 = &this->dependency_federates;
  local_28._M_device = &(this->dependency_federates).m_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<helics::GlobalFederateId*,std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>>,__gnu_cxx::__ops::_Iter_equals_val<helics::GlobalFederateId_const>>
                     ((local_30->m_obj).
                      super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (local_30->m_obj).
                      super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                      ._M_impl.super__Vector_impl_data._M_finish,&local_34);
  psVar3 = local_30;
  pGVar2 = (local_30->m_obj).
           super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__dest._M_current != pGVar2) {
    __src = __dest._M_current + 1;
    if (__src != pGVar2) {
      memmove(__dest._M_current,__src,(long)pGVar2 - (long)__src);
    }
    ppGVar1 = &(psVar3->m_obj).
               super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppGVar1 = *ppGVar1 + -1;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void TimeCoordinator::removeDependency(GlobalFederateId fedID)
{
    dependencies.removeDependency(fedID);
    // remove the thread safe version
    auto dlock = dependency_federates.lock();
    auto res = std::find(dlock.begin(), dlock.end(), fedID);
    if (res != dlock.end()) {
        dlock->erase(res);
    }
}